

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

bool __thiscall
FlatSigningProvider::GetCScript(FlatSigningProvider *this,CScriptID *scriptid,CScript *script)

{
  long lVar1;
  bool bVar2;
  CScript *in_RDX;
  CScriptID *in_RSI;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LookupHelper<std::map<CScriptID,CScript,std::less<CScriptID>,std::allocator<std::pair<CScriptID_const,CScript>>>,CScriptID,CScript>
                    (in_RDI,in_RSI,in_RDX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatSigningProvider::GetCScript(const CScriptID& scriptid, CScript& script) const { return LookupHelper(scripts, scriptid, script); }